

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrMan.c
# Opt level: O1

Rwr_Man_t * Rwr_ManStart(int fPrecompute)

{
  int iVar1;
  Rwr_Man_t *p;
  void *pvVar2;
  char *pcVar3;
  Rwr_Node_t **__s;
  Extra_MmFixed_t *pEVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  char **ppcVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  size_t __size;
  timespec ts;
  timespec local_38;
  
  clock_gettime(3,&local_38);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p = (Rwr_Man_t *)malloc(0x470);
  memset(p,0,0x470);
  p->nFuncs = 0x10000;
  pvVar2 = Abc_FrameReadManDec();
  p->puCanons = *(unsigned_short **)((long)pvVar2 + 0x18);
  p->pPhases = *(char **)((long)pvVar2 + 0x20);
  p->pPerms = *(char **)((long)pvVar2 + 0x28);
  p->pMap = *(uchar **)((long)pvVar2 + 0x30);
  pcVar3 = Rwr_ManGetPractical(p);
  p->pPractical = pcVar3;
  __size = (long)p->nFuncs << 3;
  __s = (Rwr_Node_t **)malloc(__size);
  p->pTable = __s;
  memset(__s,0,__size);
  pEVar4 = Extra_MmFixedStart(0x30);
  p->pMmNode = pEVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  p->vForest = pVVar5;
  Rwr_ManAddVar(p,0,fPrecompute);
  Rwr_ManAddVar(p,0xaaaa,fPrecompute);
  Rwr_ManAddVar(p,0xcccc,fPrecompute);
  Rwr_ManAddVar(p,0xf0f0,fPrecompute);
  Rwr_ManAddVar(p,0xff00,fPrecompute);
  p->nClasses = 5;
  p->nTravIds = 1;
  ppcVar7 = Extra_Permutations(4);
  p->pPerms4 = ppcVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x32;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(200);
  pVVar8->pArray = piVar9;
  p->vLevNums = pVVar8;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x32;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(400);
  pVVar5->pArray = ppvVar6;
  p->vFanins = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x32;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(400);
  pVVar5->pArray = ppvVar6;
  p->vFaninsCur = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x32;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(400);
  pVVar5->pArray = ppvVar6;
  p->vNodesTemp = pVVar5;
  if (fPrecompute == 0) {
    Rwr_ManLoadFromArray(p,0);
    Rwr_ManPreprocess(p);
  }
  else {
    Rwr_ManPrecompute(p);
    Rwr_ManWriteToArray(p);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeStart = lVar11 + lVar10;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts rewriting manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Rwr_Man_t * Rwr_ManStart( int  fPrecompute )
{
    Dec_Man_t * pManDec;
    Rwr_Man_t * p;
    abctime clk = Abc_Clock();
clk = Abc_Clock();
    p = ABC_ALLOC( Rwr_Man_t, 1 );
    memset( p, 0, sizeof(Rwr_Man_t) );
    p->nFuncs = (1<<16);
    pManDec   = (Dec_Man_t *)Abc_FrameReadManDec();
    p->puCanons = pManDec->puCanons; 
    p->pPhases  = pManDec->pPhases; 
    p->pPerms   = pManDec->pPerms; 
    p->pMap     = pManDec->pMap; 
    // initialize practical NPN classes
    p->pPractical  = Rwr_ManGetPractical( p );
    // create the table
    p->pTable = ABC_ALLOC( Rwr_Node_t *, p->nFuncs );
    memset( p->pTable, 0, sizeof(Rwr_Node_t *) * p->nFuncs );
    // create the elementary nodes
    p->pMmNode  = Extra_MmFixedStart( sizeof(Rwr_Node_t) );
    p->vForest  = Vec_PtrAlloc( 100 );
    Rwr_ManAddVar( p, 0x0000, fPrecompute ); // constant 0
    Rwr_ManAddVar( p, 0xAAAA, fPrecompute ); // var A
    Rwr_ManAddVar( p, 0xCCCC, fPrecompute ); // var B
    Rwr_ManAddVar( p, 0xF0F0, fPrecompute ); // var C
    Rwr_ManAddVar( p, 0xFF00, fPrecompute ); // var D
    p->nClasses = 5;
    // other stuff
    p->nTravIds   = 1;
    p->pPerms4    = Extra_Permutations( 4 );
    p->vLevNums   = Vec_IntAlloc( 50 );
    p->vFanins    = Vec_PtrAlloc( 50 );
    p->vFaninsCur = Vec_PtrAlloc( 50 );
    p->vNodesTemp = Vec_PtrAlloc( 50 );
    if ( fPrecompute )
    {   // precompute subgraphs
        Rwr_ManPrecompute( p );
//        Rwr_ManPrint( p );
        Rwr_ManWriteToArray( p );
    }
    else
    {   // load saved subgraphs
        Rwr_ManLoadFromArray( p, 0 );
//        Rwr_ManPrint( p );
        Rwr_ManPreprocess( p );
    }
p->timeStart = Abc_Clock() - clk;
    return p;
}